

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

string<wchar_t> * __thiscall irr::core::string<wchar_t>::operator=(string<wchar_t> *this,wchar_t *c)

{
  pointer pwVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (c == (wchar_t *)0x0) {
    clear(this,true);
  }
  else {
    sVar2 = wcslen(c);
    ::std::__cxx11::wstring::resize((ulong)this,(wchar_t)sVar2);
    if ((sVar2 & 0xffffffff) != 0) {
      pwVar1 = (this->str)._M_dataplus._M_p;
      uVar3 = 0;
      do {
        pwVar1[uVar3] = c[uVar3];
        uVar3 = uVar3 + 1;
      } while ((sVar2 & 0xffffffff) != uVar3);
    }
  }
  return this;
}

Assistant:

string<T> &operator=(const B *const c)
	{
		if (!c) {
			clear();
			return *this;
		}

		// no longer allowed!
		_IRR_DEBUG_BREAK_IF((void *)c == (void *)c_str());

		u32 len = calclen(c);
		str.resize(len);
		for (u32 l = 0; l < len; ++l)
			str[l] = (T)c[l];

		return *this;
	}